

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorProto_ExtensionRange::MergeFrom
          (DescriptorProto_ExtensionRange *this,Message *from)

{
  LogMessage *other;
  DescriptorProto_ExtensionRange *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if ((DescriptorProto_ExtensionRange *)from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x718);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  from_00 = (DescriptorProto_ExtensionRange *)__dynamic_cast(from,&Message::typeinfo,&typeinfo,0);
  if (from_00 == (DescriptorProto_ExtensionRange *)0x0) {
    internal::ReflectionOps::Merge(from,&this->super_Message);
  }
  else {
    MergeFrom(this,from_00);
  }
  return;
}

Assistant:

void DescriptorProto_ExtensionRange::MergeFrom(const ::google::protobuf::Message& from) {
  GOOGLE_CHECK_NE(&from, this);
  const DescriptorProto_ExtensionRange* source =
    ::google::protobuf::internal::dynamic_cast_if_available<const DescriptorProto_ExtensionRange*>(
      &from);
  if (source == NULL) {
    ::google::protobuf::internal::ReflectionOps::Merge(from, this);
  } else {
    MergeFrom(*source);
  }
}